

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall
GEO::PeriodicDelaunay3dThread::get_neighbor_along_conflict_zone_border
          (PeriodicDelaunay3dThread *this,index_t t1,index_t t1fborder,index_t t1ft2,index_t *t2,
          index_t *t2fborder,index_t *t2ft1)

{
  bool bVar1;
  index_t iVar2;
  signed_index_t v;
  index_t local_4c;
  signed_index_t v_neigh_opposite;
  index_t f21;
  index_t f12;
  index_t next_t;
  index_t cur_f;
  index_t cur_t;
  signed_index_t ev2;
  signed_index_t ev1;
  index_t *t2fborder_local;
  index_t *t2_local;
  uint local_18;
  index_t t1ft2_local;
  index_t t1fborder_local;
  index_t t1_local;
  PeriodicDelaunay3dThread *this_local;
  
  _ev2 = t2fborder;
  t2fborder_local = t2;
  t2_local._4_4_ = t1ft2;
  local_18 = t1fborder;
  t1ft2_local = t1;
  _t1fborder_local = this;
  cur_t = tet_vertex(this,t1,(int)(char)halfedge_facet_[(ulong)t1fborder + (ulong)t1ft2 * 4]);
  cur_f = tet_vertex(this,t1ft2_local,
                     (int)(char)halfedge_facet_[(ulong)t2_local._4_4_ + (ulong)local_18 * 4]);
  next_t = t1ft2_local;
  f12 = t2_local._4_4_;
  f21 = tet_adjacent(this,t1ft2_local,t2_local._4_4_);
  while( true ) {
    bVar1 = tet_is_marked_as_conflict(this,f21);
    if (!bVar1) break;
    next_t = f21;
    f12 = get_facet_by_halfedge(this,f21,cur_t,cur_f);
    f21 = tet_adjacent(this,next_t,f12);
  }
  get_facets_by_halfedge(this,f21,cur_t,cur_f,(index_t *)&v_neigh_opposite,&local_4c);
  iVar2 = tet_adjacent(this,f21,local_4c);
  *t2fborder_local = iVar2;
  v = tet_vertex(this,f21,v_neigh_opposite);
  iVar2 = find_tet_vertex(this,*t2fborder_local,v);
  *t2ft1 = iVar2;
  *_ev2 = f12;
  return *t2fborder_local != next_t;
}

Assistant:

bool get_neighbor_along_conflict_zone_border(
            index_t t1,
            index_t t1fborder,
            index_t t1ft2,
            index_t& t2,
            index_t& t2fborder,
            index_t& t2ft1
        ) const {
            
            // Note: this function is a bit long for an inline function,
            // but I observed a (modest) performance gain doing so.
            
            //   Find two vertices that are both on facets new_f and f1
            //  (the edge around which we are turning)
            //  This uses duality as follows:
            //  Primal form (not used here): 
            //    halfedge_facet_[v1][v2] returns a facet that is incident
            //    to both v1 and v2.
            //  Dual form (used here):
            //    halfedge_facet_[f1][f2] returns a vertex that both 
            //    f1 and f2 are incident to.
            signed_index_t ev1 = 
                tet_vertex(t1, index_t(halfedge_facet_[t1ft2][t1fborder]));
            signed_index_t ev2 = 
                tet_vertex(t1, index_t(halfedge_facet_[t1fborder][t1ft2]));
            
            //   Turn around edge [ev1,ev2] inside the conflict zone
            // until we reach again the boundary of the conflict zone.
            // Traversing inside the conflict zone is faster (as compared
            // to outside) since it traverses a smaller number of tets.
            index_t cur_t = t1;
            index_t cur_f = t1ft2;
            index_t next_t = index_t(tet_adjacent(cur_t,cur_f));
            while(tet_is_marked_as_conflict(next_t)) {            
                geo_debug_assert(next_t != t1);
                cur_t = next_t;
                cur_f = get_facet_by_halfedge(cur_t,ev1,ev2);
                next_t = index_t(tet_adjacent(cur_t, cur_f));
            }
             
            //  At this point, cur_t is in conflict zone and
            // next_t is outside the conflict zone.
            index_t f12,f21;
            get_facets_by_halfedge(next_t, ev1, ev2, f12, f21);
            t2 = index_t(tet_adjacent(next_t,f21));
            signed_index_t v_neigh_opposite = tet_vertex(next_t,f12);
            t2ft1 = find_tet_vertex(t2, v_neigh_opposite);
            t2fborder = cur_f;
            
            //  Test whether the found neighboring tet was created
            //  (then return true) or is an old tet in conflict
            //  (then return false).
            return(t2 != cur_t);
        }